

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_pwm_set_data(uint8_t channel,uint32_t data)

{
  long lStack_8;
  
  if (bcm2835_pwm == (uint32_t *)0xffffffffffffffff || bcm2835_clk == (uint32_t *)0xffffffffffffffff
     ) {
    return;
  }
  if (channel == '\0') {
    lStack_8 = 0x14;
  }
  else {
    if (channel != '\x01') {
      return;
    }
    lStack_8 = 0x24;
  }
  bcm2835_peri_write_nb((uint32_t *)((long)bcm2835_pwm + lStack_8),data);
  return;
}

Assistant:

void bcm2835_pwm_set_data(uint8_t channel, uint32_t data)
{
  if (   bcm2835_clk == MAP_FAILED
       || bcm2835_pwm == MAP_FAILED)
    return; /* bcm2835_init() failed or not root */

  if (channel == 0)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM0_DATA, data);
  else if (channel == 1)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM1_DATA, data);
}